

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

key_type __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::coerce_key_internal<unsigned_long>
          (tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,unsigned_long key)

{
  unsigned_long key_local;
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  return key;
}

Assistant:

key_type coerce_key_internal(T key) noexcept(
      !std::is_same_v<key_type, unodb::key_view> ||
      std::is_same_v<T, unodb::key_view>) {
    if constexpr (std::is_same_v<key_type, unodb::key_view>) {  // Db<key_view>?
      if constexpr (std::is_same_v<T, unodb::key_view>) {  // Given key_view?
        // key_view pass through
        return key;
      } else {
        // type promote and then encode the key into a key_view.
        return make_key(static_cast<u64>(key));
      }
    } else {  // type promotion.
      return static_cast<u64>(key);
    }
  }